

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O0

void __thiscall
cornerstone::async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<std::exception>_>
::~async_result(async_result<std::shared_ptr<cornerstone::resp_msg>,_std::shared_ptr<std::exception>_>
                *this)

{
  long in_RDI;
  
  std::condition_variable::~condition_variable((condition_variable *)(in_RDI + 0x70));
  std::
  function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
  ::~function((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<std::exception>_&)>
               *)0x131d0a);
  std::shared_ptr<std::exception>::~shared_ptr((shared_ptr<std::exception> *)0x131d18);
  std::shared_ptr<cornerstone::resp_msg>::~shared_ptr((shared_ptr<cornerstone::resp_msg> *)0x131d22)
  ;
  return;
}

Assistant:

~async_result()
    {
    }